

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_REP(Context *ctx)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_t in_RCX;
  char *pcVar4;
  char *fmt;
  char topbranch [32];
  char failbranch [32];
  char src0 [64];
  char scratch [32];
  char acStack_c8 [32];
  char local_a8 [32];
  char local_88 [64];
  char local_48 [40];
  
  pcVar4 = acStack_c8;
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_88,in_RCX);
  if (ctx->profile_supports_nv4 == 0) {
    if (ctx->profile_supports_nv2 == 0) {
      failf(ctx,"%s","branching unsupported in this profile");
      return;
    }
    if (ctx->shader_type != MOJOSHADER_TYPE_PIXEL) {
      uVar1 = ctx->assigned_branch_labels;
      ctx->assigned_branch_labels = uVar1 + 2;
      snprintf(local_a8,0x20,"branch_label%d",(ulong)(uVar1 + 1));
      snprintf(acStack_c8,0x20,"branch_label%d",(ulong)uVar1);
      uVar2 = ctx->branch_labels_stack_index;
      uVar3 = (ulong)uVar2;
      if (0x1e < uVar3) {
        __assert_fail("((size_t) ctx->branch_labels_stack_index) < STATICARRAYLEN(ctx->branch_labels_stack)-1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1e66,"void emit_ARB1_REP(Context *)");
      }
      ctx->branch_labels_stack[uVar3] = uVar1;
      ctx->branch_labels_stack_index = uVar2 + 2;
      ctx->branch_labels_stack[uVar3 + 1] = uVar1 + 1;
      snprintf(local_48,0x20,"rep%d",(ulong)(uint)ctx->reps);
      output_line(ctx,"MOVC %s.x, %s;",local_48,local_88);
      output_line(ctx,"BRA %s (LE.x);",local_a8);
      fmt = "%s:";
      goto LAB_00115ed7;
    }
  }
  fmt = "REP %s;";
  pcVar4 = local_88;
LAB_00115ed7:
  output_line(ctx,fmt,pcVar4);
  return;
}

Assistant:

static void emit_ARB1_REP(Context *ctx)
{
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));

    // nv2 fragment programs (and everything nv4) have a real REP.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        output_line(ctx, "REP %s;", src0);

    else if (support_nv2(ctx))
    {
        // no REP, but we can use branches.
        char failbranch[32];
        char topbranch[32];
        const int toplabel = allocate_branch_label(ctx);
        const int faillabel = allocate_branch_label(ctx);
        get_ARB1_branch_label_name(ctx,faillabel,failbranch,sizeof(failbranch));
        get_ARB1_branch_label_name(ctx,toplabel,topbranch,sizeof(topbranch));

        assert(((size_t) ctx->branch_labels_stack_index) <
                STATICARRAYLEN(ctx->branch_labels_stack)-1);

        ctx->branch_labels_stack[ctx->branch_labels_stack_index++] = toplabel;
        ctx->branch_labels_stack[ctx->branch_labels_stack_index++] = faillabel;

        char scratch[32];
        snprintf(scratch, sizeof (scratch), "rep%d", ctx->reps);
        output_line(ctx, "MOVC %s.x, %s;", scratch, src0);
        output_line(ctx, "BRA %s (LE.x);", failbranch);
        output_line(ctx, "%s:", topbranch);
    } // else if

    else  // stock ARB1 has no branching.
    {
        fail(ctx, "branching unsupported in this profile");
    } // else
}